

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseUnboundFuncSignature(WastParser *this,FuncSignature *sig)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_60 [8];
  ResolveTypes result_references;
  ResolveTypes param_references;
  FuncSignature *sig_local;
  WastParser *this_local;
  
  param_references.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sig;
  ResolveTypes::ResolveTypes
            ((ResolveTypes *)
             &result_references.vars.
              super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&sig->param_types);
  ResolveTypes::ResolveTypes
            ((ResolveTypes *)local_60,
             (TypeVector *)
             &((param_references.vars.
                super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->var).loc.field_1.field_0);
  RVar2 = ParseUnboundValueTypeList
                    (this,Param,
                     (TypeVector *)
                     param_references.vars.
                     super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (ReferenceVars *)&param_references);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ParseResultList(this,(TypeVector *)
                                 &((param_references.vars.
                                    super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->var).loc.
                                  field_1.field_0,(ReferenceVars *)&result_references);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      bVar1 = std::
              vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
              ::empty((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                       *)&param_references);
      if (!bVar1) {
        std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
        ::push_back(&this->resolve_types_,
                    (value_type *)
                    &result_references.vars.
                     super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      bVar1 = std::
              vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
              ::empty((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                       *)&result_references);
      if (!bVar1) {
        std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
        ::push_back(&this->resolve_types_,(value_type *)local_60);
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  ResolveTypes::~ResolveTypes((ResolveTypes *)local_60);
  ResolveTypes::~ResolveTypes
            ((ResolveTypes *)
             &result_references.vars.
              super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseUnboundFuncSignature(FuncSignature* sig) {
  WABT_TRACE(ParseUnboundFuncSignature);

  ResolveTypes param_references(&sig->param_types);
  ResolveTypes result_references(&sig->result_types);

  CHECK_RESULT(ParseUnboundValueTypeList(TokenType::Param, &sig->param_types,
                                         &param_references.vars));
  CHECK_RESULT(ParseResultList(&sig->result_types, &result_references.vars));

  if (!param_references.vars.empty()) {
    resolve_types_.push_back(param_references);
  }

  if (!result_references.vars.empty()) {
    resolve_types_.push_back(result_references);
  }

  return Result::Ok;
}